

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O3

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int iVar2;
  bool bVar3;
  CF2_F16Dot16 CVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  FT_UFast idx;
  undefined7 in_register_00000089;
  int *piVar9;
  int iVar10;
  CF2_F16Dot16 local_98 [2];
  int iStack_90;
  CF2_F16Dot16 local_8c [7];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined4 local_5c;
  int *local_58;
  int *local_50;
  CF2_Stack local_48;
  CF2_GlyphPath local_40;
  FT_Bool local_31;
  
  local_5c = (int)CONCAT71(in_register_00000089,doConditionalLastRead);
  local_48 = opStack;
  local_58 = curX;
  local_98[0] = *curX;
  local_50 = curY;
  local_98[1] = *curY;
  local_40 = (CF2_GlyphPath)readFromStack;
  FVar1 = readFromStack[9];
  local_31 = FVar1;
  lVar8 = 0;
  idx = 0;
  do {
    iVar2 = local_98[lVar8];
    (&iStack_90)[lVar8] = iVar2;
    if (*(char *)((long)(local_40->hintMap).edge + lVar8 + -0x38) != '\0') {
      CVar4 = cf2_stack_getReal(local_48,idx);
      (&iStack_90)[lVar8] = CVar4 + iVar2;
      idx = idx + 1;
    }
    piVar9 = local_50;
    lVar8 = lVar8 + 1;
  } while (10 - (ulong)(FVar1 == '\0') != lVar8);
  if (local_31 == '\0') {
    local_6c = *local_50;
  }
  iVar2 = local_6c;
  if ((char)local_5c == '\0') {
    if (*(char *)((long)&local_40->callbacks + 2) == '\0') {
      iVar10 = *local_58;
    }
    else {
      CVar4 = cf2_stack_getReal(local_48,idx);
      iVar10 = CVar4 + local_70;
      idx = idx + 1;
    }
    iVar2 = local_6c;
    local_68 = iVar10;
    if (*(char *)((long)&local_40->callbacks + 3) == '\0') {
      local_64 = *piVar9;
    }
    else {
      CVar4 = cf2_stack_getReal(local_48,idx);
      local_64 = CVar4 + iVar2;
    }
  }
  else {
    iVar5 = local_70 - *local_58;
    iVar10 = -iVar5;
    if (0 < iVar5) {
      iVar10 = iVar5;
    }
    iVar6 = local_6c - *local_50;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    local_40 = glyphPath;
    CVar4 = cf2_stack_getReal(local_48,idx);
    piVar9 = local_50;
    glyphPath = local_40;
    if (iVar5 < iVar10) {
      iVar10 = CVar4 + local_70;
      local_68 = iVar10;
      local_64 = *local_50;
    }
    else {
      iVar10 = *local_58;
      local_68 = iVar10;
      local_64 = CVar4 + iVar2;
    }
  }
  iVar2 = local_64;
  lVar8 = 0;
  bVar3 = true;
  do {
    bVar7 = bVar3;
    cf2_glyphpath_curveTo
              (glyphPath,(&iStack_90)[lVar8],local_8c[lVar8],local_8c[lVar8 + 1],local_8c[lVar8 + 2]
               ,local_8c[lVar8 + 3],local_8c[lVar8 + 4]);
    lVar8 = 6;
    bVar3 = false;
  } while (bVar7);
  local_48->top = local_48->buffer;
  *local_58 = iVar10;
  *piVar9 = iVar2;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = (FT_Bool)(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }